

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::async_connect(rpc_client *this)

{
  address *in_RDI;
  address addr;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffe0;
  endpoint_type *in_stack_ffffffffffffffe8;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_fffffffffffffff0;
  
  asio::ip::address::from_string((string *)in_RDI);
  asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<asio::ip::tcp> *)&(in_RDI->ipv6_address_).scope_id_,in_RDI,0);
  asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
  async_connect<rest_rpc::rpc_client::async_connect()::_lambda(std::error_code_const&)_1_>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void async_connect() {
    assert(port_ != 0);
    auto addr = asio::ip::address::from_string(host_);
    socket_.async_connect({addr, port_}, [this](const asio::error_code &ec) {
      if (has_connected_ || stop_client_) {
        return;
      }

      if (ec) {
        // std::cout << ec.message() << std::endl;

        has_connected_ = false;

        if (reconnect_cnt_ <= 0) {
          return;
        }

        if (reconnect_cnt_ > 0) {
          reconnect_cnt_--;
        }

        async_reconnect();
      } else {
        // std::cout<<"connected ok"<<std::endl;
        if (is_ssl()) {
          handshake();
          return;
        }

        has_connected_ = true;
        do_read();
        resend_subscribe();
        if (has_wait_)
          conn_cond_.notify_one();
      }
    });
  }